

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)> * __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::range<0ul,char_const(&)[4],char_const(&)[4]>
          (TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)>
           *__return_storage_ptr__,
          Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
          *this,char (*params) [4],char (*params_1) [4])

{
  IterRange<kj::_::BTreeImpl::Iterator> inner_00;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_00;
  char (*begin) [4];
  char (*end) [4];
  IterRange<kj::_::BTreeImpl::Iterator> *__src;
  StringPtr *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> local_60;
  undefined1 local_50 [8];
  IterRange<kj::_::BTreeImpl::Iterator> inner;
  char (*params_local_1) [4];
  char (*params_local) [4];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  inner.e._16_8_ = params_1;
  this_00 = get<0ul,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>&>
                      ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(this + 0x20));
  local_60 = Vector<kj::TreeMap<kj::String,_int>::Entry>::asPtr
                       ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  begin = ::const(params);
  end = ::const((char (*) [4])inner.e._16_8_);
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  range<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4],char_const(&)[4]>
            ((IterRange<kj::_::BTreeImpl::Iterator> *)local_50,
             (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)this_00,local_60,begin,end);
  __src = mv<kj::_::IterRange<kj::_::BTreeImpl::Iterator>>
                    ((IterRange<kj::_::BTreeImpl::Iterator> *)local_50);
  memcpy(&local_90,__src,0x30);
  local_98 = Vector<kj::TreeMap<kj::String,_int>::Entry>::begin
                       ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  inner_00.b.leaf = (Leaf *)uStack_88;
  inner_00.b.tree = (NodeUnion *)local_90;
  inner_00.b._16_8_ = local_80;
  inner_00.e.tree = (NodeUnion *)uStack_78;
  inner_00.e.leaf = (Leaf *)local_70;
  inner_00.e._16_8_ = uStack_68;
  _::
  MappedIterable<kj::_::IterRange<kj::_::BTreeImpl::Iterator>,kj::_::TableMapping<kj::TreeMap<kj::String,int>::Entry>>
  ::MappedIterable<kj::TreeMap<kj::String,int>::Entry*>
            ((MappedIterable<kj::_::IterRange<kj::_::BTreeImpl::Iterator>,kj::_::TableMapping<kj::TreeMap<kj::String,int>::Entry>>
              *)__return_storage_ptr__,inner_00,&local_98);
  return __return_storage_ptr__;
}

Assistant:

auto Table<Row, Indexes...>::range(Params&&... params) {
  auto inner = get<index>(indexes).range(rows.asPtr(), kj::fwd<Params>(params)...);
  return _::TableIterable<Row, decltype(inner)>(kj::mv(inner), rows.begin());
}